

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O1

DOMNode * __thiscall
xercesc_4_0::DOMDocumentImpl::adoptNode(DOMDocumentImpl *this,DOMNode *sourceNode)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  undefined4 extraout_var_01;
  DOMException *this_00;
  long lVar3;
  DOMAttr *sourceAttr;
  undefined4 extraout_var_00;
  
  iVar1 = (*sourceNode->_vptr_DOMNode[0xc])(sourceNode);
  if ((DOMDocument *)CONCAT44(extraout_var,iVar1) != &this->super_DOMDocument) {
    return (DOMNode *)0x0;
  }
  iVar1 = (*sourceNode->_vptr_DOMNode[4])(sourceNode);
  if (iVar1 == 2) {
    iVar1 = (*sourceNode->_vptr_DOMNode[0x2c])(sourceNode);
    plVar2 = (long *)CONCAT44(extraout_var_01,iVar1);
    if (plVar2 == (long *)0x0) goto LAB_0026bb7d;
    lVar3 = 0x170;
  }
  else {
    if (iVar1 - 9U < 2) {
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_00,9,0,this->fMemoryManager);
      __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
    }
    iVar1 = (*sourceNode->_vptr_DOMNode[5])(sourceNode);
    plVar2 = (long *)CONCAT44(extraout_var_00,iVar1);
    if (plVar2 == (long *)0x0) goto LAB_0026bb7d;
    lVar3 = 0x80;
  }
  (**(code **)(*plVar2 + lVar3))(plVar2,sourceNode);
LAB_0026bb7d:
  DOMNodeImpl::callUserDataHandlers(&this->fNode,NODE_ADOPTED,sourceNode,sourceNode);
  return (DOMNode *)0x0;
}

Assistant:

DOMNode* DOMDocumentImpl::adoptNode(DOMNode* sourceNode) {
    if(sourceNode->getOwnerDocument()!=this)
    {
        // cannot take ownership of a node created by another document, as it comes from its memory pool
        // and would be delete when the original document is deleted
        return 0;
    }
    // if the adopted node is already part of this document (i.e. the source and target document are the same),
    // this method still has the effect of removing the source node from the child list of its parent, if any
    switch(sourceNode->getNodeType())
    {
    case DOCUMENT_NODE:
    case DOCUMENT_TYPE_NODE:
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, getMemoryManager());
    case ATTRIBUTE_NODE:
        {
            DOMAttr* sourceAttr=(DOMAttr*)sourceNode;
            DOMElement* sourceAttrElem=sourceAttr->getOwnerElement();
            if(sourceAttrElem)
                sourceAttrElem->removeAttributeNode(sourceAttr);
            fNode.callUserDataHandlers(DOMUserDataHandler::NODE_ADOPTED, sourceNode, sourceNode);
            break;
        }
    default:
        {
            DOMNode* sourceNodeParent=sourceNode->getParentNode();
            if(sourceNodeParent)
                sourceNodeParent->removeChild(sourceNode);
            fNode.callUserDataHandlers(DOMUserDataHandler::NODE_ADOPTED, sourceNode, sourceNode);
        }
    }
    return 0;
}